

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

int Wlc_NtkPrepareBits(Wlc_Ntk_t *p)

{
  uint uVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  uVar1 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar1) {
    piVar4 = (p->vCopies).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vCopies).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCopies).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vCopies).nSize = uVar1;
  iVar3 = 0;
  if (1 < p->iObj) {
    iVar3 = 0;
    lVar5 = 1;
    lVar6 = 9;
    do {
      if (p->nObjsAlloc <= lVar5) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlc.h"
                      ,0xa9,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((p->vCopies).nSize <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pWVar2 = p->pObjs;
      (p->vCopies).pArray[lVar5] = iVar3;
      iVar8 = *(int *)((long)pWVar2 + lVar6 * 4 + -4) - *(int *)(&pWVar2->field_0x0 + lVar6 * 4);
      iVar7 = -iVar8;
      if (0 < iVar8) {
        iVar7 = iVar8;
      }
      iVar3 = iVar3 + iVar7 + 1;
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 6;
    } while (lVar5 < p->iObj);
  }
  return iVar3;
}

Assistant:

int Wlc_NtkPrepareBits( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    int i, nBits = 0;
    Wlc_NtkCleanCopy( p );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        Wlc_ObjSetCopy( p, i, nBits );
        nBits += Wlc_ObjRange(pObj);
    }
    return nBits;
}